

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSearch.hpp
# Opt level: O1

void __thiscall QuantLib::LineSearch::~LineSearch(LineSearch *this)

{
  pointer pdVar1;
  
  this->_vptr_LineSearch = (_func_int **)&PTR__LineSearch_00305438;
  pdVar1 = (this->gradient_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->gradient_).data_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar1 = (this->xtd_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->xtd_).data_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar1 = (this->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->searchDirection_).data_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
    return;
  }
  return;
}

Assistant:

virtual ~LineSearch() {}